

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getStringOptionValues
                   (void *highs,char *option,char *current_value,char *default_value)

{
  HighsStatus HVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  HighsInt retcode;
  string default_v;
  string current_v;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string *in_stack_ffffffffffffff30;
  Highs *in_stack_ffffffffffffff38;
  allocator local_89;
  string local_88 [36];
  HighsStatus local_64;
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_10,&local_89);
  HVar1 = Highs::getStringOptionValues
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (string *)0x438099);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_64 = HVar1;
  if (local_18 != (char *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strcpy(local_18,pcVar2);
  }
  if (local_20 != (char *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    strcpy(local_20,pcVar2);
  }
  HVar1 = local_64;
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return HVar1;
}

Assistant:

HighsInt Highs_getStringOptionValues(const void* highs, const char* option,
                                     char* current_value, char* default_value) {
  std::string current_v;
  std::string default_v;
  // Inherited from Highs_getStringOptionValue: cannot see why this
  // was ever useful. Must assume that current_value is of length at
  // least 7, which isn't necessarily true
  //
  //  if (current_value) memset(current_value, 0, 7);
  //  if (default_value) memset(default_value, 0, 7);
  HighsInt retcode =
      (HighsInt)((Highs*)highs)
          ->getStringOptionValues(std::string(option), &current_v, &default_v);
  // current_value and default_value are nullptr by default
  if (current_value) strcpy(current_value, current_v.c_str());
  if (default_value) strcpy(default_value, default_v.c_str());
  return retcode;
}